

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

string * pstore::path::win32::base_name(string *__return_storage_ptr__,string *path)

{
  string p;
  string drive;
  undefined1 *local_68;
  string *local_60;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  drive._M_dataplus._M_p = (pointer)&drive.field_2;
  drive._M_string_length = 0;
  drive.field_2._M_local_buf[0] = '\0';
  p._M_dataplus._M_p = (pointer)&p.field_2;
  p._M_string_length = 0;
  p.field_2._M_local_buf[0] = '\0';
  split_drive(&local_58,path);
  local_60 = &drive;
  local_68 = (undefined1 *)&p;
  std::tuple<std::__cxx11::string&,std::__cxx11::string&>::operator=
            ((tuple<std::__cxx11::string&,std::__cxx11::string&> *)&local_68,&local_58);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_58);
  std::__cxx11::string::find_last_of((char *)&p,0x120fc9);
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&p);
  std::__cxx11::string::~string((string *)&p);
  std::__cxx11::string::~string((string *)&drive);
  return __return_storage_ptr__;
}

Assistant:

std::string base_name (std::string const & path) {
                std::string drive;
                std::string p;
                std::tie (drive, p) = path::win32::split_drive (path);

                std::string::size_type const pos = p.find_last_of (R"(/\)");
                return p.substr ((pos == std::string::npos) ? 0 : pos + 1);
            }